

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::mouseDoubleClickEvent(QGraphicsView *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  MouseEventSource source;
  MouseEventFlags flags;
  undefined8 uVar6;
  QWidget *widget;
  QObject *pQVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  QPointF QVar11;
  QPointF local_68;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (*(long *)(lVar1 + 0x498) != 0)) && ((*(uint *)(lVar1 + 0x300) & 1) != 0)) {
    *(uint *)(lVar1 + 0x300) = *(uint *)(lVar1 + 0x300) | 8;
    this_00 = (QEventStorage<QMouseEvent> *)(lVar1 + 0x410);
    if ((this_00 != (QEventStorage<QMouseEvent> *)event) || (*(char *)(lVar1 + 0x460) == '\0')) {
      QEventStorage<QMouseEvent>::store(this_00,event);
    }
    auVar10 = QEventPoint::position();
    dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._0_8_
    ;
    bVar3 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    dVar8 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._8_8_
    ;
    bVar4 = 2147483647.0 < dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    *(ulong *)(lVar1 + 0x358) =
         CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar8),
                  (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar9))
    ;
    QVar11 = mapToScene(this,(QPoint *)(lVar1 + 0x358));
    *(QPointF *)(lVar1 + 0x348) = QVar11;
    auVar10 = QEventPoint::globalPosition();
    dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._0_8_
    ;
    bVar3 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    dVar8 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._8_8_
    ;
    bVar4 = 2147483647.0 < dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    uVar6 = CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar4 & (ulong)dVar8),
                     (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar3 & (ulong)dVar9));
    *(undefined8 *)(lVar1 + 0x360) = uVar6;
    *(undefined8 *)(lVar1 + 0x368) = *(undefined8 *)(lVar1 + 0x348);
    *(undefined8 *)(lVar1 + 0x370) = *(undefined8 *)(lVar1 + 0x350);
    *(undefined8 *)(lVar1 + 0x388) = uVar6;
    *(undefined4 *)(lVar1 + 0x398) = *(undefined4 *)(event + 0x40);
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMouseDoubleClick);
    widget = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,widget);
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(lVar1 + 0x398),
               (QPointF *)(lVar1 + 0x348));
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(lVar1 + 0x398),
               (QPoint *)(lVar1 + 0x360));
    local_68 = mapToScene(this,(QPoint *)(lVar1 + 0x358));
    QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_58,&local_68);
    QGraphicsSceneMouseEvent::setScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,(QPoint *)(lVar1 + 0x360));
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)local_58,(QPointF *)(lVar1 + 0x368));
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,(QPoint *)(lVar1 + 0x388));
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
    local_58[0xc] = 0;
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    source = QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
    flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i
         = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    lVar2 = *(long *)(lVar1 + 0x490);
    if (event[0xb] == (QMouseEvent)0x1) {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = *(QObject **)(lVar1 + 0x498);
      }
      qt_sendSpontaneousEvent(pQVar7,(QEvent *)local_58);
    }
    else {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = *(QObject **)(lVar1 + 0x498);
      }
      QCoreApplication::sendEvent(pQVar7,(QEvent *)local_58);
    }
    uVar5 = local_58[0xc];
    (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
    (**(code **)(*(long *)&this_00->field_0 + 0x10))(this_00,uVar5);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    d->storeMouseEvent(event);
    d->mousePressViewPoint = event->position().toPoint();
    d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
    d->mousePressScreenPoint = event->globalPosition().toPoint();
    d->lastMouseMoveScenePoint = d->mousePressScenePoint;
    d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
    d->mousePressButton = event->button();

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseDoubleClick);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(d->mousePressViewPoint));
    mouseEvent.setScreenPos(d->mousePressScreenPoint);
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setAccepted(false);
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the original mouse event accepted state.
    const bool isAccepted = mouseEvent.isAccepted();
    event->setAccepted(isAccepted);

    // Update the last mouse event accepted state.
    d->lastMouseEvent->setAccepted(isAccepted);
}